

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_setup_connection(connectdata *conn)

{
  SessionHandle *data_00;
  CURLcode result;
  SessionHandle *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  conn_local._4_4_ = imap_init(conn);
  if (conn_local._4_4_ == CURLE_OK) {
    if ((((conn->bits).httpproxy & 1U) == 0) || (((data_00->set).tunnel_thru_httpproxy & 1U) != 0))
    {
      (data_00->state).path = (data_00->state).path + 1;
      conn_local._4_4_ = CURLE_OK;
    }
    else if (conn->handler == &Curl_handler_imap) {
      conn->handler = &Curl_handler_imap_proxy;
      conn_local._4_4_ = (*conn->handler->setup_connection)(conn);
    }
    else {
      Curl_failf(data_00,"IMAPS not supported!");
      conn_local._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_setup_connection(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;

  /* Initialise the IMAP layer */
  CURLcode result = imap_init(conn);
  if(result)
    return result;

  if(conn->bits.httpproxy && !data->set.tunnel_thru_httpproxy) {
    /* Unless we have asked to tunnel IMAP operations through the proxy, we
       switch and use HTTP operations only */
#ifndef CURL_DISABLE_HTTP
    if(conn->handler == &Curl_handler_imap)
      conn->handler = &Curl_handler_imap_proxy;
    else {
#ifdef USE_SSL
      conn->handler = &Curl_handler_imaps_proxy;
#else
      failf(data, "IMAPS not supported!");
      return CURLE_UNSUPPORTED_PROTOCOL;
#endif
    }

    /* set it up as an HTTP connection instead */
    return conn->handler->setup_connection(conn);
#else
    failf(data, "IMAP over http proxy requires HTTP support built-in!");
    return CURLE_UNSUPPORTED_PROTOCOL;
#endif
  }

  data->state.path++;   /* don't include the initial slash */

  return CURLE_OK;
}